

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O1

void elf_initoutput(GlobalVars *gv,uint32_t init_file_offset,int8_t output_endianess)

{
  Phdr *pPVar1;
  unsigned_long uVar2;
  
  elf_file_hdr_gap = 0;
  elf_endianess = output_endianess;
  elfoffset = init_file_offset;
  if (gv->phdrlist == (Phdr *)0x0) {
    pPVar1 = (Phdr *)alloczero(0x58);
    pPVar1->name = " dummy";
    pPVar1->type = 1;
    pPVar1->flags = 0x17;
    pPVar1->file_end = 0xffffffff;
    pPVar1->mem_end = 0xffffffff;
    uVar2 = (*fff[gv->dest_format]->headersize)(gv);
    pPVar1->offset = uVar2;
    gv->phdrlist = pPVar1;
  }
  initlist(&shdrlist);
  initlist(&phdrlist);
  elfshdridx = 0;
  elfsymtabidx = elf_addstrlist(&elfshstrlist,".symtab");
  elfstrtabidx = elf_addstrlist(&elfshstrlist,".strtab");
  elfshstrtabidx = elf_addstrlist(&elfshstrlist,".shstrtab");
  return;
}

Assistant:

void elf_initoutput(struct GlobalVars *gv,
                    uint32_t init_file_offset,int8_t output_endianess)
/* initialize section header, program header, relocation, symbol, */
/* string and section header string lists */
{
  elf_endianess = output_endianess;
  elfoffset = init_file_offset;
  elf_file_hdr_gap = 0;

  if (gv->phdrlist == NULL) {
    /* we need to provide at least one dummy PHDR, even for reloc-objects */
    struct Phdr *p = alloczero(sizeof(struct Phdr));

    p->name = " dummy";
    p->type = PT_LOAD;
    p->flags = PF_X|PF_W|PF_R|PHDR_USED;
    p->mem_end = p->file_end = 0xffffffff;
    p->offset = fff[gv->dest_format]->headersize(gv);
    gv->phdrlist = p;
  }

  initlist(&shdrlist);
  initlist(&phdrlist);
  elfshdridx = 0;

  elfsymtabidx = elf_addshdrstr(".symtab");
  elfstrtabidx = elf_addshdrstr(".strtab");
  elfshstrtabidx = elf_addshdrstr(".shstrtab");
}